

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

la_ssize_t archive_read_data(archive *_a,void *buff,size_t s)

{
  long lVar1;
  size_t *psVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  la_ssize_t lVar7;
  ulong __n_00;
  void *read_buf;
  char *local_48;
  int64_t *local_40;
  size_t *local_38;
  
  if (s == 0) {
    lVar7 = 0;
  }
  else {
    local_38 = &_a->read_data_remaining;
    local_40 = &_a->read_data_offset;
    lVar7 = 0;
    do {
      psVar2 = local_38;
      if (*local_38 == 0) {
        local_48 = _a->read_data_block;
        _a->read_data_is_posix_read = '\x01';
        _a->read_data_requested = s;
        iVar3 = archive_read_data_block(_a,&local_48,local_38,local_40);
        _a->read_data_block = local_48;
        if (iVar3 == 1) {
          return lVar7;
        }
        if (iVar3 < 0) {
          return (long)iVar3;
        }
      }
      lVar4 = _a->read_data_offset;
      lVar1 = _a->read_data_output_offset;
      if (lVar4 < lVar1) {
        archive_set_error(_a,0x54,"Encountered out-of-order sparse blocks");
        return -10;
      }
      __n = lVar4 - lVar1;
      if (__n == 0 || lVar4 < lVar1) {
        __n = 0;
      }
      if ((long)(lVar1 + s) < lVar4) {
        __n = s;
      }
      memset(buff,0,__n);
      lVar4 = _a->read_data_output_offset + __n;
      lVar7 = lVar7 + __n;
      _a->read_data_output_offset = lVar4;
      uVar6 = s - __n;
      if (uVar6 == 0) break;
      uVar5 = *psVar2;
      __n_00 = uVar5;
      if (uVar6 <= uVar5) {
        __n_00 = uVar6;
      }
      if (__n_00 != 0) {
        memcpy((void *)((long)buff + __n),_a->read_data_block,__n_00);
        lVar4 = _a->read_data_output_offset;
        uVar5 = _a->read_data_remaining;
      }
      _a->read_data_block = _a->read_data_block + __n_00;
      _a->read_data_offset = _a->read_data_offset + __n_00;
      buff = (void *)((long)((long)buff + __n) + __n_00);
      lVar7 = lVar7 + __n_00;
      _a->read_data_remaining = uVar5 - __n_00;
      _a->read_data_output_offset = lVar4 + __n_00;
      s = uVar6 - __n_00;
    } while (s != 0);
  }
  _a->read_data_is_posix_read = '\0';
  _a->read_data_requested = 0;
  return lVar7;
}

Assistant:

la_ssize_t
archive_read_data(struct archive *_a, void *buff, size_t s)
{
	struct archive *a = (struct archive *)_a;
	char	*dest;
	const void *read_buf;
	size_t	 bytes_read;
	size_t	 len;
	int	 r;

	bytes_read = 0;
	dest = (char *)buff;

	while (s > 0) {
		if (a->read_data_remaining == 0) {
			read_buf = a->read_data_block;
			a->read_data_is_posix_read = 1;
			a->read_data_requested = s;
			r = archive_read_data_block(a, &read_buf,
			    &a->read_data_remaining, &a->read_data_offset);
			a->read_data_block = read_buf;
			if (r == ARCHIVE_EOF)
				return (bytes_read);
			/*
			 * Error codes are all negative, so the status
			 * return here cannot be confused with a valid
			 * byte count.  (ARCHIVE_OK is zero.)
			 */
			if (r < ARCHIVE_OK)
				return (r);
		}

		if (a->read_data_offset < a->read_data_output_offset) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered out-of-order sparse blocks");
			return (ARCHIVE_RETRY);
		}

		/* Compute the amount of zero padding needed. */
		if (a->read_data_output_offset + (int64_t)s <
		    a->read_data_offset) {
			len = s;
		} else if (a->read_data_output_offset <
		    a->read_data_offset) {
			len = (size_t)(a->read_data_offset -
			    a->read_data_output_offset);
		} else
			len = 0;

		/* Add zeroes. */
		memset(dest, 0, len);
		s -= len;
		a->read_data_output_offset += len;
		dest += len;
		bytes_read += len;

		/* Copy data if there is any space left. */
		if (s > 0) {
			len = a->read_data_remaining;
			if (len > s)
				len = s;
			if (len)
				memcpy(dest, a->read_data_block, len);
			s -= len;
			a->read_data_block += len;
			a->read_data_remaining -= len;
			a->read_data_output_offset += len;
			a->read_data_offset += len;
			dest += len;
			bytes_read += len;
		}
	}
	a->read_data_is_posix_read = 0;
	a->read_data_requested = 0;
	return (bytes_read);
}